

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O3

int __thiscall
absl::synchronization_internal::MutexDelay(synchronization_internal *this,int32_t c,int mode)

{
  int iVar1;
  int extraout_EDX;
  undefined4 in_register_00000014;
  undefined4 extraout_var;
  int iVar2;
  SchedulingMode scheduling_mode;
  Duration duration;
  
  scheduling_mode = c;
  if (absl::(anonymous_namespace)::globals != 0xdd) {
    base_internal::CallOnceImpl<absl::(anonymous_namespace)::GetMutexGlobals()::__0>
              ((Nonnull<std::atomic<uint32_t>_*>)&absl::(anonymous_namespace)::globals,c,
               (anon_class_1_0_00000001 *)CONCAT44(in_register_00000014,mode));
    mode = extraout_EDX;
    in_register_00000014 = extraout_var;
  }
  iVar1 = *(int *)(&DAT_00196a88 + (long)c * 4);
  if (absl::(anonymous_namespace)::globals != 0xdd) {
    base_internal::CallOnceImpl<absl::(anonymous_namespace)::GetMutexGlobals()::__0>
              ((Nonnull<std::atomic<uint32_t>_*>)&absl::(anonymous_namespace)::globals,
               scheduling_mode,(anon_class_1_0_00000001 *)CONCAT44(in_register_00000014,mode));
  }
  iVar2 = (int)this;
  if (iVar1 <= iVar2) {
    if (iVar1 != iVar2) {
      duration.rep_lo_ = DAT_00196a98;
      duration.rep_hi_ = DAT_00196a90;
      AbslInternalSleepFor(duration);
      return 0;
    }
    AbslInternalMutexYield();
  }
  return iVar2 + 1;
}

Assistant:

int MutexDelay(int32_t c, int mode) {
  const int32_t limit = GetMutexGlobals().mutex_sleep_spins[mode];
  const absl::Duration sleep_time = GetMutexGlobals().mutex_sleep_time;
  if (c < limit) {
    // Spin.
    c++;
  } else {
    SchedulingGuard::ScopedEnable enable_rescheduling;
    ABSL_TSAN_MUTEX_PRE_DIVERT(nullptr, 0);
    if (c == limit) {
      // Yield once.
      ABSL_INTERNAL_C_SYMBOL(AbslInternalMutexYield)();
      c++;
    } else {
      // Then wait.
      absl::SleepFor(sleep_time);
      c = 0;
    }
    ABSL_TSAN_MUTEX_POST_DIVERT(nullptr, 0);
  }
  return c;
}